

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

void rgbcx::prepare_bc1_single_color_table_half
               (bc1_match_entry *pTable,uint8_t *pExpand,int size,bc1_approx_mode mode)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  int hi;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  bc1_match_entry *pbVar14;
  int iVar15;
  
  lVar12 = 0;
  uVar3 = 0;
  if (0 < size) {
    uVar3 = (ulong)(uint)size;
  }
  do {
    if (lVar12 == 0x100) {
      return;
    }
    pbVar14 = pTable + lVar12;
    iVar15 = 0x100;
    uVar4 = 0;
    for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
      bVar1 = pExpand[uVar7];
      uVar13 = (uint)bVar1;
      uVar6 = uVar4;
      for (uVar5 = 0; (uint)size != uVar5; uVar5 = uVar5 + 1) {
        bVar2 = pExpand[uVar5];
        uVar8 = (uint)bVar2;
        if (size == 0x20) {
          if (mode == cBC1AMD) {
LAB_00114bdc:
            uVar8 = uVar8 + bVar1 + 1 >> 1;
          }
          else {
            if (mode != cBC1NVidia) goto LAB_00114bf3;
            uVar8 = (uint)(uVar6 >> 3);
          }
LAB_00114be4:
          iVar9 = uVar8 - (int)lVar12;
          iVar11 = -iVar9;
          if (0 < iVar9) {
            iVar11 = iVar9;
          }
        }
        else {
          if (mode == cBC1AMD) goto LAB_00114bdc;
          if (mode == cBC1NVidia) {
            uVar8 = (int)((int)(uVar13 - bVar2) / 4 + (uint)bVar2 * 0x100 + (uVar13 - bVar2) * 0x80
                         + 0x80) / 0x100;
            goto LAB_00114be4;
          }
LAB_00114bf3:
          iVar9 = (uVar8 + uVar13 >> 1) - (int)lVar12;
          iVar11 = -iVar9;
          if (0 < iVar9) {
            iVar11 = iVar9;
          }
          if ((mode == cBC1IdealRound4) || (mode == cBC1Ideal)) {
            iVar10 = uVar8 - uVar13;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            iVar11 = iVar11 + (uint)(iVar9 * 3) / 100;
          }
        }
        if ((iVar11 < iVar15) || ((uVar7 == uVar5 && (iVar11 == iVar15)))) {
          pbVar14->m_hi = (uint8_t)uVar5;
          pbVar14->m_lo = (uint8_t)uVar7;
          pbVar14->m_e = (uint8_t)iVar11;
          iVar15 = iVar11;
        }
        uVar6 = (ulong)((int)uVar6 + 0x21);
      }
      uVar4 = (ulong)((int)uVar4 + 0x21);
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

static void prepare_bc1_single_color_table_half(bc1_match_entry* pTable, const uint8_t* pExpand, int size, bc1_approx_mode mode)
	{
		for (int i = 0; i < 256; i++)
		{
			int lowest_e = 256;
			for (int lo = 0; lo < size; lo++)
			{
				const int lo_e = pExpand[lo];

				for (int hi = 0; hi < size; hi++)
				{
					const int hi_e = pExpand[hi];
										
					const int v = (size == 32) ? interp_half_5(hi, lo, hi_e, lo_e, mode) : interp_half_6(hi, lo, hi_e, lo_e, mode);
											
					int e = iabs(v - i);

					// We only need to factor in 3% error in BC1 ideal mode.
					if ((mode == bc1_approx_mode::cBC1Ideal) || (mode == bc1_approx_mode::cBC1IdealRound4))
						e += (iabs(hi_e - lo_e) * 3) / 100;

					// Favor equal endpoints, for lower error on actual GPU's which approximate the interpolation.
					if ((e < lowest_e) || ((e == lowest_e) && (lo == hi)))
					{
						pTable[i].m_hi = static_cast<uint8_t>(hi);
						pTable[i].m_lo = static_cast<uint8_t>(lo);
						
						assert(e <= UINT8_MAX);
						pTable[i].m_e = static_cast<uint8_t>(e);

						lowest_e = e;
					}

				} // hi
			} // lo
		}
	}